

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::ReplacementVisitor::visit(ReplacementVisitor *this,DirectionalAtom *datom)

{
  undefined1 (*pauVar1) [16];
  double dVar2;
  DataStoragePointer DVar3;
  Snapshot *pSVar4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [8];
  ReplacementVisitor *pRVar12;
  DirectionalAtom *atom;
  uint i;
  iterator iVar13;
  ostream *poVar14;
  long lVar15;
  undefined8 *puVar16;
  undefined1 *puVar17;
  uint i_3;
  double (*padVar18) [3];
  undefined8 *puVar19;
  uint j_1;
  double (*__return_storage_ptr__) [3];
  StuntDouble *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  undefined8 *puVar20;
  double *pdVar21;
  uint j;
  long lVar22;
  double *pdVar23;
  uint k;
  long lVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  undefined4 uVar25;
  pointer psVar26;
  element_type *peVar27;
  undefined4 uVar28;
  undefined1 auVar29 [16];
  SquareMatrix3<double> result;
  Mat3x3d mat;
  Vector3d newVec;
  Vector<double,_3U> result_5;
  Vector3d vel;
  Vector3d pos;
  Mat3x3d I;
  RotMat3x3d Atrans;
  RotMat3x3d A;
  Mat3x3d skewMat;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_300;
  undefined1 local_2e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2e0;
  undefined1 local_2d8 [96];
  undefined1 local_278 [16];
  double local_268 [6];
  RealType local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  undefined4 local_224;
  ReplacementVisitor *local_220;
  shared_ptr<OpenMD::GenericData> local_218;
  value_type local_208;
  AtomInfo *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f0;
  pointer local_1e8;
  double local_1d8 [4];
  DirectionalAtom *local_1b8;
  element_type *local_1b0;
  double local_1a8 [4];
  double local_188 [4];
  double local_168 [10];
  undefined8 local_118 [10];
  undefined8 local_c8 [10];
  double local_78;
  undefined1 auStack_70 [16];
  double dStack_60;
  undefined8 local_58;
  undefined1 auStack_50 [16];
  double dStack_40;
  undefined8 local_38;
  
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[8] = 0;
  local_118[8] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_168[8] = 0.0;
  local_168[6] = 0.0;
  local_168[7] = 0.0;
  local_168[4] = 0.0;
  local_168[5] = 0.0;
  local_168[2] = 0.0;
  local_168[3] = 0.0;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_188[2] = 0.0;
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_1a8[2] = 0.0;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_38 = 0;
  dStack_40 = 0.0;
  local_58 = 0;
  auStack_50 = ZEXT816(0);
  dStack_60 = 0.0;
  local_78 = 0.0;
  auStack_70 = ZEXT816(0);
  local_1e8 = (pointer)0x0;
  local_1f8 = (AtomInfo *)0x0;
  p_Stack_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(local_2d8 + 0x60);
  iVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&(this->myTypes_)._M_t,(key_type *)(local_2d8 + 0x60));
  puVar17 = local_278 + 0x10;
  if ((undefined1 *)local_278._0_8_ != puVar17) {
    operator_delete((void *)local_278._0_8_,(long)local_268[0] + 1);
  }
  if ((_Rb_tree_header *)iVar13._M_node == &(this->myTypes_)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  local_278._0_8_ = puVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2d8 + 0x60),"ATOMDATA","");
  this_00 = (StuntDouble *)local_2e8;
  StuntDouble::getPropertyByName(this_00,(string *)datom);
  local_300 = _Stack_2e0._M_pi;
  auVar11 = local_2e8;
  local_2e8 = (undefined1  [8])0x0;
  _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((undefined1 *)local_278._0_8_ != puVar17) {
    operator_delete((void *)local_278._0_8_,(long)local_268[0] + 1);
  }
  local_230 = local_300;
  if (auVar11 == (undefined1  [8])0x0) {
    local_278._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 8),
               (AtomData **)(local_2d8 + 0x60),(allocator<OpenMD::AtomData> *)local_2e8);
  }
  else {
    local_2d8._88_8_ = __dynamic_cast(auVar11,&GenericData::typeinfo,&AtomData::typeinfo,0);
    if ((element_type *)local_2d8._88_8_ != (element_type *)0x0) {
      uVar25 = (undefined4)CONCAT71((int7)((ulong)puVar17 >> 8),1);
      if (local_300 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_300->_M_use_count = local_300->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_300->_M_use_count = local_300->_M_use_count + 1;
        }
      }
      goto LAB_0021ce29;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can not get Atom Data from ",0x1b);
    (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(local_2d8 + 0x60,datom);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_278._0_8_,local_278._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    if ((undefined1 *)local_278._0_8_ != puVar17) {
      operator_delete((void *)local_278._0_8_,(long)local_268[0] + 1);
    }
    local_278._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_278 + 8),
               (AtomData **)(local_2d8 + 0x60),(allocator<OpenMD::AtomData> *)local_2e8);
  }
  local_2d8._88_8_ = local_278._0_8_;
  local_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_;
  uVar25 = 0;
LAB_0021ce29:
  DVar3 = (datom->super_Atom).super_StuntDouble.storage_;
  pSVar4 = ((datom->super_Atom).super_StuntDouble.snapshotMan_)->currentSnapshot_;
  lVar15 = *(long *)((long)&(pSVar4->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar3);
  lVar22 = (long)(datom->super_Atom).super_StuntDouble.localIndex_ * 0x18;
  local_188[2] = *(double *)(lVar15 + 0x10 + lVar22);
  pdVar21 = (double *)(lVar15 + lVar22);
  local_188[0] = *pdVar21;
  local_188[1] = pdVar21[1];
  lVar15 = *(long *)((long)&(pSVar4->atomData).velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar3);
  pdVar21 = (double *)(lVar15 + lVar22);
  local_1a8[0] = *pdVar21;
  local_1a8[1] = pdVar21[1];
  local_1a8[2] = *(double *)(lVar15 + 0x10 + lVar22);
  lVar15 = *(long *)((long)&(pSVar4->atomData).angularMomentum.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar3);
  pauVar1 = (undefined1 (*) [16])(lVar15 + lVar22);
  dVar2 = *(double *)*pauVar1;
  uVar8 = *(ulong *)(*pauVar1 + 8);
  auVar10 = *pauVar1;
  local_2d8._64_8_ = *(double *)(lVar15 + 0x10 + lVar22);
  local_2d8._72_8_ = (_Base_ptr)0x0;
  (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[5])(local_2d8 + 0x60,datom);
  lVar15 = 0;
  do {
    *(undefined8 *)((long)local_168 + lVar15 + 0x10) = *(undefined8 *)(local_278 + lVar15 + 0x10);
    uVar9 = *(undefined8 *)(local_278 + lVar15 + 8);
    *(undefined8 *)((long)local_168 + lVar15) = *(undefined8 *)(local_2d8 + lVar15 + 0x60);
    *(undefined8 *)((long)local_168 + lVar15 + 8) = uVar9;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x48);
  __return_storage_ptr__ = (double (*) [3])(local_2d8 + 0x60);
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,(StuntDouble *)datom);
  lVar15 = 0;
  do {
    *(undefined8 *)((long)local_c8 + lVar15 + 0x10) = *(undefined8 *)(local_278 + lVar15 + 0x10);
    uVar9 = *(undefined8 *)(local_278 + lVar15 + 8);
    *(undefined8 *)((long)local_c8 + lVar15) = *(undefined8 *)(local_2d8 + lVar15 + 0x60);
    *(undefined8 *)((long)local_c8 + lVar15 + 8) = uVar9;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x48);
  lVar15 = 0;
  local_78 = 0.0;
  auVar29._8_8_ = uVar8 ^ 0x8000000000000000;
  auVar29._0_8_ = local_2d8._64_8_;
  uVar28 = (undefined4)((ulong)local_168[4] >> 0x20);
  auVar6._8_4_ = SUB84(local_168[4],0);
  auVar6._0_8_ = local_168[8];
  auVar6._12_4_ = uVar28;
  auStack_70 = divpd(auVar29,auVar6);
  dStack_60 = -(double)local_2d8._64_8_ / local_168[8];
  local_58 = 0;
  auVar7._8_4_ = SUB84(local_168[4],0);
  auVar7._0_8_ = local_168[0];
  auVar7._12_4_ = uVar28;
  auStack_50 = divpd(auVar10,auVar7);
  dStack_40 = -dVar2 / local_168[0];
  local_38 = 0;
  local_2d8._48_8_ = (_func_int **)0x0;
  local_2d8._32_8_ = 0;
  local_2d8._40_8_ = 0.0;
  local_2d8._16_8_ = 0;
  local_2d8._24_4_ = 0;
  local_2d8._28_4_ = 0;
  local_2d8._0_8_ = (pointer)0x0;
  local_2d8._8_8_ = (SnapshotManager *)0x0;
  local_2e8 = (undefined1  [8])0x0;
  _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar16 = local_c8;
  do {
    lVar22 = 0;
    pdVar21 = &local_78;
    do {
      dVar2 = *(double *)(local_2e8 + (lVar15 * 3 + lVar22) * 8);
      lVar24 = 0;
      pdVar23 = pdVar21;
      do {
        dVar2 = dVar2 + (double)puVar16[lVar24] * *pdVar23;
        lVar24 = lVar24 + 1;
        pdVar23 = pdVar23 + 3;
      } while (lVar24 != 3);
      *(double *)(local_2e8 + (lVar15 * 3 + lVar22) * 8) = dVar2;
      lVar22 = lVar22 + 1;
      pdVar21 = pdVar21 + 1;
    } while (lVar22 != 3);
    lVar15 = lVar15 + 1;
    puVar16 = puVar16 + 3;
  } while (lVar15 != 3);
  local_268[4] = 0.0;
  local_268[5] = 0.0;
  local_268[2] = 0.0;
  local_268[3] = 0.0;
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_278._0_8_ = 0.0;
  local_278._8_8_ = 0.0;
  local_238 = 0.0;
  lVar15 = 0;
  do {
    lVar22 = 0;
    padVar18 = __return_storage_ptr__;
    do {
      (((SquareMatrix<double,_3> *)*padVar18)->super_RectMatrix<double,_3U,_3U>).data_[0][0] =
           (double)(&this_00->_vptr_StuntDouble)[lVar22];
      lVar22 = lVar22 + 1;
      padVar18 = padVar18 + 1;
    } while (lVar22 != 3);
    lVar15 = lVar15 + 1;
    __return_storage_ptr__ = (double (*) [3])(*__return_storage_ptr__ + 1);
    this_00 = (StuntDouble *)&this_00->snapshotMan_;
  } while (lVar15 != 3);
  puVar16 = (undefined8 *)local_2e8;
  local_2d8._32_8_ = 0;
  local_2d8._40_8_ = 0.0;
  local_2d8._16_8_ = 0;
  local_2d8._24_4_ = 0;
  local_2d8._28_4_ = 0;
  local_2d8._0_8_ = (pointer)0x0;
  local_2d8._8_8_ = (SnapshotManager *)0x0;
  local_2e8 = (undefined1  [8])0x0;
  _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2d8._48_8_ = (_func_int **)0x0;
  puVar19 = local_c8;
  lVar15 = 0;
  do {
    lVar22 = 0;
    puVar20 = puVar16;
    do {
      *puVar20 = puVar19[lVar22];
      lVar22 = lVar22 + 1;
      puVar20 = puVar20 + 3;
    } while (lVar22 != 3);
    lVar15 = lVar15 + 1;
    puVar16 = puVar16 + 1;
    puVar19 = puVar19 + 3;
  } while (lVar15 != 3);
  local_224 = uVar25;
  lVar15 = 0;
  do {
    *(undefined8 *)((long)local_118 + lVar15 + 0x10) = *(undefined8 *)(local_2d8 + lVar15);
    uVar9 = *(undefined8 *)((long)&_Stack_2e0._M_pi + lVar15);
    *(undefined8 *)((long)local_118 + lVar15) = *(undefined8 *)(local_2e8 + lVar15);
    *(undefined8 *)((long)local_118 + lVar15 + 8) = uVar9;
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x48);
  local_220 = this;
  peVar5 = (this->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar26 = (peVar5->data).
            super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = datom;
  if (psVar26 ==
      (peVar5->data).
      super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    peVar27 = (psVar26->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_03 = (psVar26->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_03->_M_use_count = this_03->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_03->_M_use_count = this_03->_M_use_count + 1;
      }
    }
    if (peVar27 == (element_type *)0x0) {
      this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_1b0 = (element_type *)(local_2d8._88_8_ + 0x28);
      this_02._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        local_2d8._64_8_ = this_03;
        local_2e8 = (undefined1  [8])0x0;
        _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2d8._0_8_ = (pointer)0x0;
        puVar16 = local_118;
        lVar15 = 0;
        do {
          dVar2 = *(double *)(local_2e8 + lVar15 * 8);
          lVar22 = 0;
          do {
            dVar2 = dVar2 + (double)puVar16[lVar22] *
                            (peVar27->pos).super_Vector<double,_3U>.data_[lVar22];
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          *(double *)(local_2e8 + lVar15 * 8) = dVar2;
          lVar15 = lVar15 + 1;
          puVar16 = puVar16 + 3;
        } while (lVar15 != 3);
        local_1e8 = (pointer)local_2d8._0_8_;
        local_1f8 = (AtomInfo *)local_2e8;
        p_Stack_1f0 = _Stack_2e0._M_pi;
        local_2e8 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<OpenMD::AtomInfo,std::allocator<OpenMD::AtomInfo>>
                  (&_Stack_2e0,(AtomInfo **)local_2e8,(allocator<OpenMD::AtomInfo> *)local_1d8);
        this_01._M_pi = _Stack_2e0._M_pi;
        auVar11 = local_2e8;
        local_2e8 = (undefined1  [8])0x0;
        _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi),
           _Stack_2e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2e0._M_pi);
        }
        std::__cxx11::string::_M_assign((string *)auVar11);
        pRVar12 = local_220;
        local_2e8 = (undefined1  [8])0x0;
        _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2d8._0_8_ = (pointer)0x0;
        lVar15 = 0;
        do {
          *(double *)(local_2e8 + lVar15 * 8) = local_188[lVar15] + (double)(&local_1f8)[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        (((Vector3d *)((long)auVar11 + 0x28))->super_Vector<double,_3U>).data_[2] =
             (double)local_2d8._0_8_;
        (((Vector3d *)((long)auVar11 + 0x28))->super_Vector<double,_3U>).data_[0] =
             (double)local_2e8;
        (((Vector3d *)((long)auVar11 + 0x28))->super_Vector<double,_3U>).data_[1] =
             (double)_Stack_2e0._M_pi;
        if (peVar27->hasVector == true) {
          local_2e8 = (undefined1  [8])0x0;
          _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_2d8._0_8_ = (pointer)0x0;
          puVar16 = local_118;
          lVar15 = 0;
          do {
            dVar2 = *(double *)(local_2e8 + lVar15 * 8);
            lVar22 = 0;
            do {
              dVar2 = dVar2 + (double)puVar16[lVar22] *
                              (peVar27->vec).super_Vector<double,_3U>.data_[lVar22];
              lVar22 = lVar22 + 1;
            } while (lVar22 != 3);
            *(double *)(local_2e8 + lVar15 * 8) = dVar2;
            lVar15 = lVar15 + 1;
            puVar16 = puVar16 + 3;
          } while (lVar15 != 3);
          local_1e8 = (pointer)local_2d8._0_8_;
          local_1f8 = (AtomInfo *)local_2e8;
          p_Stack_1f0 = _Stack_2e0._M_pi;
          (((Vector3d *)((long)auVar11 + 0x40))->super_Vector<double,_3U>).data_[2] =
               (double)local_2d8._0_8_;
          (((Vector3d *)((long)auVar11 + 0x40))->super_Vector<double,_3U>).data_[0] =
               (double)local_2e8;
          (((Vector3d *)((long)auVar11 + 0x40))->super_Vector<double,_3U>).data_[1] =
               (double)_Stack_2e0._M_pi;
        }
        else if ((Vector3d *)((long)auVar11 + 0x40) != (Vector3d *)&OpenMD::V3Zero) {
          lVar15 = 0;
          do {
            *(undefined8 *)
             ((long)(((Vector3d *)((long)auVar11 + 0x40))->super_Vector<double,_3U>).data_ + lVar15)
                 = *(undefined8 *)((long)&OpenMD::V3Zero + lVar15);
            lVar15 = lVar15 + 8;
          } while (lVar15 != 0x18);
        }
        local_1d8[0] = 0.0;
        local_1d8[1] = 0.0;
        local_1d8[2] = 0.0;
        puVar17 = local_2d8 + 0x60;
        lVar15 = 0;
        do {
          dVar2 = local_1d8[lVar15];
          lVar22 = 0;
          do {
            dVar2 = dVar2 + *(double *)(puVar17 + lVar22 * 8) *
                            (peVar27->pos).super_Vector<double,_3U>.data_[lVar22];
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          local_1d8[lVar15] = dVar2;
          lVar15 = lVar15 + 1;
          puVar17 = puVar17 + 0x18;
        } while (lVar15 != 3);
        local_2e8 = (undefined1  [8])0x0;
        _Stack_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2d8._0_8_ = (pointer)0x0;
        lVar15 = 0;
        do {
          *(double *)(local_2e8 + lVar15 * 8) = local_1a8[lVar15] + local_1d8[lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
        (((Vector3d *)((long)auVar11 + 0x58))->super_Vector<double,_3U>).data_[2] =
             (double)local_2d8._0_8_;
        (((Vector3d *)((long)auVar11 + 0x58))->super_Vector<double,_3U>).data_[0] =
             (double)local_2e8;
        (((Vector3d *)((long)auVar11 + 0x58))->super_Vector<double,_3U>).data_[1] =
             (double)_Stack_2e0._M_pi;
        *(bool *)((long)auVar11 + 0xaa) = true;
        local_208.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)auVar11;
        local_208.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = this_01._M_pi;
        if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
          }
        }
        std::
        vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
        ::push_back((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                     *)local_1b0,&local_208);
        if (local_208.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (psVar26 + 1 ==
            (((pRVar12->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->data).
            super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          peVar27 = (element_type *)0x0;
LAB_0021d482:
          this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          peVar27 = psVar26[1].super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          this_03 = psVar26[1].super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          if (this_03 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0021d482;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_03->_M_use_count = this_03->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_03->_M_use_count = this_03->_M_use_count + 1;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._64_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._64_8_);
        }
        this_02._M_pi = this_01._M_pi;
        psVar26 = psVar26 + 1;
      } while (peVar27 != (element_type *)0x0);
    }
  }
  atom = local_1b8;
  if ((char)local_224 == '\0') {
    local_2e8 = (undefined1  [8])local_2d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"ATOMDATA","");
    uVar9 = local_2d8._88_8_;
    std::__cxx11::string::_M_assign((string *)(local_2d8._88_8_ + 8));
    if (local_2e8 != (undefined1  [8])local_2d8) {
      operator_delete((void *)local_2e8,(ulong)(local_2d8._0_8_ + 1));
    }
    local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar9;
    local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = local_300;
    if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_300->_M_use_count = local_300->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_300->_M_use_count = local_300->_M_use_count + 1;
      }
    }
    StuntDouble::addProperty((StuntDouble *)atom,&local_218);
    if (local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  BaseAtomVisitor::setVisited(&local_220->super_BaseAtomVisitor,&atom->super_Atom);
  if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
  }
  if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
  }
  if (local_300 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_300);
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  return;
}

Assistant:

void ReplacementVisitor::visit(DirectionalAtom* datom) {
    RotMat3x3d A;
    RotMat3x3d Atrans;
    Mat3x3d I;
    Vector3d pos;
    Vector3d vel;
    Vector3d frc;
    Vector3d trq;
    Vector3d j;
    Mat3x3d skewMat;

    Vector3d newVec;
    std::shared_ptr<AtomInfo> atomInfo;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<GenericData> data;
    bool haveAtomData;

    // if atom is not one of our recognized atom types, just skip it
    if (!isReplacedAtom(datom->getType())) return;

    data = datom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << datom->getType()
                  << std::endl;
        atomData     = std::make_shared<AtomData>();
        haveAtomData = false;
      } else
        haveAtomData = true;
    } else {
      atomData     = std::make_shared<AtomData>();
      haveAtomData = false;
    }

    pos = datom->getPos();
    vel = datom->getVel();

    j = datom->getJ();
    I = datom->getI();
    A = datom->getA();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = j[2] / I(2, 2);
    skewMat(0, 2) = -j[1] / I(1, 1);
    skewMat(1, 0) = -j[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = j[0] / I(0, 0);
    skewMat(2, 0) = j[1] / I(1, 1);
    skewMat(2, 1) = -j[0] / I(0, 0);
    skewMat(2, 2) = 0;
    Mat3x3d mat   = (A * skewMat).transpose();

    // We need A^T to convert from body-fixed to space-fixed:
    Atrans = A.transpose();

    std::shared_ptr<AtomInfo> siteInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator iter;

    for (siteInfo = sites_->beginAtomInfo(iter); siteInfo;
         siteInfo = sites_->nextAtomInfo(iter)) {
      newVec = Atrans * siteInfo->pos;

      atomInfo               = std::make_shared<AtomInfo>();
      atomInfo->atomTypeName = siteInfo->atomTypeName;
      atomInfo->pos          = pos + newVec;

      if (siteInfo->hasVector) {
        newVec        = Atrans * siteInfo->vec;
        atomInfo->vec = newVec;
      } else {
        atomInfo->vec = V3Zero;
      }

      atomInfo->vel         = vel + mat * siteInfo->pos;
      atomInfo->hasVelocity = true;

      atomData->addAtomInfo(atomInfo);
    }
    if (!haveAtomData) {
      atomData->setID("ATOMDATA");
      datom->addProperty(atomData);
    }

    setVisited(datom);
  }